

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# assembler.h
# Opt level: O0

Matrix<double,__1,_1,_0,__1,_1> __thiscall
lf::assemble::
AssembleVectorLocally<Eigen::Matrix<double,_1,1,0,_1,1>,lf::uscalfe::LinearFELocalLoadVector<double,lf::mesh::utils::MeshFunctionGlobal<std::function<double(Eigen::Matrix<double,2,1,0,2,1>const&)>>&>>
          (assemble *this,dim_t codim,DofHandler *dof_handler,
          LinearFELocalLoadVector<double,_lf::mesh::utils::MeshFunctionGlobal<std::function<double_(const_Eigen::Matrix<double,_2,_1,_0,_2,_1>_&)>_>_&>
          *entity_vector_provider)

{
  Index extraout_RDX;
  Matrix<double,__1,_1,_0,__1,_1> MVar1;
  uint local_30;
  undefined1 local_29;
  LinearFELocalLoadVector<double,_lf::mesh::utils::MeshFunctionGlobal<std::function<double_(const_Eigen::Matrix<double,_2,_1,_0,_2,_1>_&)>_>_&>
  *local_28;
  LinearFELocalLoadVector<double,_lf::mesh::utils::MeshFunctionGlobal<std::function<double_(const_Eigen::Matrix<double,_2,_1,_0,_2,_1>_&)>_>_&>
  *entity_vector_provider_local;
  DofHandler *dof_handler_local;
  assemble *paStack_10;
  dim_t codim_local;
  Matrix<double,__1,_1,_0,__1,_1> *resultvector;
  
  local_29 = 0;
  local_28 = entity_vector_provider;
  entity_vector_provider_local =
       (LinearFELocalLoadVector<double,_lf::mesh::utils::MeshFunctionGlobal<std::function<double_(const_Eigen::Matrix<double,_2,_1,_0,_2,_1>_&)>_>_&>
        *)dof_handler;
  dof_handler_local._4_4_ = codim;
  paStack_10 = this;
  local_30 = (*dof_handler->_vptr_DofHandler[2])();
  Eigen::Matrix<double,_-1,_1,_0,_-1,_1>::Matrix<unsigned_int>
            ((Matrix<double,__1,_1,_0,__1,_1> *)this,&local_30);
  Eigen::DenseBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::setZero
            ((DenseBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)this);
  AssembleVectorLocally<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_lf::uscalfe::LinearFELocalLoadVector<double,_lf::mesh::utils::MeshFunctionGlobal<std::function<double_(const_Eigen::Matrix<double,_2,_1,_0,_2,_1>_&)>_>_&>_>
            (dof_handler_local._4_4_,(DofHandler *)entity_vector_provider_local,local_28,
             (Matrix<double,__1,_1,_0,__1,_1> *)this);
  MVar1.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows =
       extraout_RDX;
  MVar1.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data =
       (double *)this;
  return (Matrix<double,__1,_1,_0,__1,_1>)
         MVar1.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage;
}

Assistant:

VECTOR AssembleVectorLocally(dim_t codim, const DofHandler &dof_handler,
                             ENTITY_VECTOR_PROVIDER &entity_vector_provider) {
  // Allocated vector holding r.h.s. vector to be assembled
  VECTOR resultvector{dof_handler.NumDofs()};
  // Initialize to zero: assembly of new vector
  resultvector.setZero();
  // Perform actual assembly
  AssembleVectorLocally<VECTOR, ENTITY_VECTOR_PROVIDER>(
      codim, dof_handler, entity_vector_provider, resultvector);
  return resultvector;
}